

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intCheck.c
# Opt level: O2

void Inter_CheckStop(Inter_Check_t *p)

{
  if (p != (Inter_Check_t *)0x0) {
    Vec_IntFree(p->vOrLits);
    Vec_IntFree(p->vAndLits);
    Vec_IntFree(p->vAssLits);
    Cnf_DataFree(p->pCnf);
    Aig_ManStop(p->pFrames);
    sat_solver_delete(p->pSat);
    free(p);
    return;
  }
  return;
}

Assistant:

void Inter_CheckStop( Inter_Check_t * p )
{
    if ( p == NULL )
        return;
    Vec_IntFree( p->vOrLits );
    Vec_IntFree( p->vAndLits );
    Vec_IntFree( p->vAssLits );
    Cnf_DataFree( p->pCnf );
    Aig_ManStop( p->pFrames );
    sat_solver_delete( p->pSat );
    ABC_FREE( p );
}